

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O3

Index wasm::Bits::getMaxBits<wasm::OptimizeInstructions>
                (Expression *curr,OptimizeInstructions *localInfoProvider)

{
  ulong uVar1;
  BinaryOp BVar2;
  bool bVar3;
  Id IVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Index IVar8;
  Index IVar9;
  Expression *pEVar10;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  long local_40;
  Index local_34;
  
  local_34 = 0xffffffff;
  uVar5 = 1;
LAB_009d4b6f:
  IVar4 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
          _id;
  if (UnaryId < IVar4) {
    if (IVar4 < RefIsNullId) {
      if (IVar4 == BinaryId) {
        bVar3 = Binary::isRelational((Binary *)curr);
        goto LAB_009d4b98;
      }
      goto LAB_009d4ba3;
    }
    if (IVar4 < RefTestId) {
      if ((IVar4 == RefIsNullId) || (IVar4 == RefEqId)) goto LAB_009d4d2a;
      goto LAB_009d4ba3;
    }
    if (IVar4 == RefTestId) goto LAB_009d4d2a;
    if (IVar4 != StringEqId) goto LAB_009d4ba3;
    if (((Binary *)curr)->op == AddInt32) goto LAB_009d4d2a;
    goto switchD_009d4bc3_caseD_9;
  }
  if (IVar4 == UnaryId) {
    bVar3 = Unary::isRelational((Unary *)curr);
LAB_009d4b98:
    if (bVar3 != false) goto LAB_009d4d2a;
    IVar4 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
            _id;
  }
LAB_009d4ba3:
  if (IVar4 == LocalSetId) goto code_r0x009d4ba7;
  switch(IVar4) {
  case LocalGetId:
    if (localInfoProvider == (OptimizeInstructions *)0x0) {
      __assert_fail("localInfoProvider",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                    ,0x1c3,
                    "Index wasm::Bits::getMaxBits(Expression *, LocalInfoProvider *) [LocalInfoProvider = wasm::OptimizeInstructions]"
                   );
    }
    uVar5 = (localInfoProvider->localInfo).
            super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>._M_impl.
            super__Vector_impl_data._M_start[((Binary *)curr)->op].maxBits;
    goto LAB_009d4d2a;
  default:
    goto switchD_009d4bc3_caseD_9;
  case LoadId:
    local_50.i64 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).
                   super_Expression.type.id;
    if ((((5 < local_50.func.super_IString.str._M_len) ||
         ((0x32UL >> (local_50.func.super_IString.str._M_len & 0x3f) & 1) == 0)) &&
        (BVar2 = ((Binary *)curr)->op, uVar5 = wasm::Type::getByteSize((Type *)&local_50.func),
        (byte)(char)BVar2 < uVar5)) && (*(byte *)((long)&((Binary *)curr)->op + 1) == 0)) {
      uVar5 = (uint)(byte)(char)((Binary *)curr)->op << 3;
      goto LAB_009d4d2a;
    }
    goto switchD_009d4bc3_caseD_9;
  case ConstId:
    uVar1 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
            type.id;
    if (uVar1 < 7) {
      iVar6 = (int)uVar1;
      if (iVar6 == 3) {
        Literal::countLeadingZeroes((Literal *)&local_50.func,(Literal *)&((Binary *)curr)->op);
        if (local_40 != 3) goto LAB_009d52b8;
        iVar6 = 0x40;
      }
      else {
        if (iVar6 != 2) {
          handle_unreachable("invalid type",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                             ,0xa3);
        }
        Literal::countLeadingZeroes((Literal *)&local_50.func,(Literal *)&((Binary *)curr)->op);
        if (local_40 != 2) goto LAB_009d52d7;
        iVar6 = 0x20;
      }
      Literal::~Literal((Literal *)&local_50.func);
      uVar5 = iVar6 - local_50._0_4_;
      goto LAB_009d4d2a;
    }
    goto LAB_009d5262;
  case UnaryId:
    switch(((Binary *)curr)->op) {
    case AddInt32:
    case MulInt32:
    case DivUInt32:
      uVar5 = 6;
      goto LAB_009d4d2a;
    case SubInt32:
    case DivSInt32:
    case RemSInt32:
      uVar5 = 7;
      goto LAB_009d4d2a;
    case RemUInt32:
    case AndInt32:
    case OrInt32:
    case XorInt32:
    case ShlInt32:
    case ShrSInt32:
    case ShrUInt32:
    case RotLInt32:
    case RotRInt32:
    case EqInt32:
    case NeInt32:
    case LtSInt32:
    case LtUInt32:
    case LeSInt32:
      goto switchD_009d4bc3_caseD_9;
    case LeUInt32:
    case GtSInt32:
      handle_unreachable("relationals handled before",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                         ,0x1a2);
    case GtUInt32:
switchD_009d4c4b_caseD_16:
      IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
      bVar3 = IVar8 < 0x20;
      goto LAB_009d4e1b;
    case GeSInt32:
    case GeUInt32:
      uVar5 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
      break;
    default:
      switch(((Binary *)curr)->op) {
      case GtUInt64:
        IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
        bVar3 = IVar8 < 8;
        goto LAB_009d4e31;
      case GeSInt64:
        IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
        bVar3 = IVar8 < 0x10;
LAB_009d4e31:
        uVar5 = 0x20;
        goto LAB_009d4e36;
      case GeUInt64:
        IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
        bVar3 = IVar8 < 8;
        break;
      case AddFloat32:
        IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
        bVar3 = IVar8 < 0x10;
        break;
      case SubFloat32:
        goto switchD_009d4c4b_caseD_16;
      default:
        goto switchD_009d4bc3_caseD_9;
      }
LAB_009d4e1b:
      uVar5 = 0x40;
LAB_009d4e36:
      if (!bVar3) {
        IVar8 = uVar5;
      }
LAB_009d4e39:
      if (IVar8 <= local_34) {
        return IVar8;
      }
      return local_34;
    }
    goto LAB_009d4db1;
  case BinaryId:
    goto switchD_009d4bc3_caseD_10;
  }
code_r0x009d4ba7:
  curr = ((Binary *)curr)->left;
  goto LAB_009d4b6f;
switchD_009d4bc3_caseD_9:
  uVar1 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
          type.id;
  if (6 < uVar1) {
LAB_009d5262:
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  uVar5 = (int)uVar1 - 1;
  if (2 < uVar5) {
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                       ,0x1d4);
  }
  uVar5 = *(uint *)(&DAT_00df92d8 + (ulong)uVar5 * 4);
  goto LAB_009d4d2a;
switchD_009d4bc3_caseD_10:
  switch(((Binary *)curr)->op) {
  case AddInt32:
    IVar9 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
    IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->right,localInfoProvider);
    if (IVar8 < IVar9) {
      IVar8 = IVar9;
    }
    uVar5 = IVar8 + 1;
LAB_009d4db1:
    if (local_34 <= uVar5) {
      uVar5 = local_34;
    }
    bVar3 = uVar5 < 0x20;
    uVar7 = 0x20;
LAB_009d4dc1:
    if (!bVar3) {
      uVar5 = uVar7;
    }
    return uVar5;
  case SubInt32:
  case RotLInt32:
  case RotRInt32:
    uVar5 = 0x20;
    break;
  case MulInt32:
    IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->right,localInfoProvider);
    IVar9 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
    uVar5 = IVar9 + IVar8;
    goto LAB_009d4db1;
  case DivSInt32:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x20;
    if ((pEVar10->_id != ConstId) ||
       (IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider),
       IVar8 == 0x20)) break;
    if (*(long *)(pEVar10 + 2) != 2) {
LAB_009d52d7:
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    if (*(int *)(pEVar10 + 1) < 0) break;
    goto LAB_009d5170;
  case DivUInt32:
  case DivUInt64:
    uVar5 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
    if (((Binary *)curr)->right->_id == ConstId) {
      IVar8 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                        (((Binary *)curr)->right,(DummyLocalInfoProvider *)0x0);
      uVar7 = (uVar5 - IVar8) + 1;
      if ((int)(uVar5 - IVar8) < 0) {
        uVar7 = 0;
      }
      if ((int)uVar7 < (int)uVar5) {
        uVar5 = uVar7;
      }
    }
    break;
  case RemSInt32:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x20;
    if ((pEVar10->_id != ConstId) ||
       (IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider),
       IVar8 == 0x20)) break;
    if (*(long *)(pEVar10 + 2) != 2) goto LAB_009d52d7;
    uVar7 = ceilLog2(*(uint32_t *)(pEVar10 + 1));
    goto LAB_009d523b;
  case RemUInt32:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x20;
    if (pEVar10->_id != ConstId) break;
    uVar5 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
    if (*(long *)(pEVar10 + 2) != 2) goto LAB_009d52d7;
    uVar7 = ceilLog2(*(uint32_t *)(pEVar10 + 1));
    goto LAB_009d4faf;
  case AndInt32:
    IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
    curr = ((Binary *)curr)->right;
    if (IVar8 <= local_34) {
      local_34 = IVar8;
    }
    goto LAB_009d4b6f;
  case OrInt32:
  case XorInt32:
  case OrInt64:
  case XorInt64:
    IVar9 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
    IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->right,localInfoProvider);
    if (IVar8 < IVar9) {
      IVar8 = IVar9;
    }
    goto LAB_009d4e39;
  case ShlInt32:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x20;
    if (pEVar10->_id != ConstId) break;
    IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
    IVar9 = getEffectiveShifts(pEVar10);
    uVar7 = IVar9 + IVar8;
    bVar3 = uVar7 < 0x20;
    uVar5 = 0x20;
    goto LAB_009d5077;
  case ShrSInt32:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x20;
    if ((pEVar10->_id != ConstId) ||
       (uVar7 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider),
       uVar7 == 0x20)) break;
    goto LAB_009d5112;
  case ShrUInt32:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x20;
    goto LAB_009d51c9;
  case EqInt32:
  case NeInt32:
  case LtSInt32:
  case LtUInt32:
  case LeSInt32:
  case LeUInt32:
  case GtSInt32:
  case GtUInt32:
  case GeSInt32:
  case GeUInt32:
  case EqInt64:
  case NeInt64:
  case LtSInt64:
  case LtUInt64:
  case LeSInt64:
  case LeUInt64:
  case GtSInt64:
  case GtUInt64:
  case GeSInt64:
  case GeUInt64:
  case EqFloat32:
  case NeFloat32:
  case LtFloat32:
  case LeFloat32:
  case GtFloat32:
  case GeFloat32:
  case EqFloat64:
  case NeFloat64:
  case LtFloat64:
  case LeFloat64:
  case GtFloat64:
  case GeFloat64:
    handle_unreachable("relationals handled before",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                       ,0x192);
  case AddInt64:
    IVar9 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
    IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->right,localInfoProvider);
    if (IVar8 < IVar9) {
      IVar8 = IVar9;
    }
    uVar5 = IVar8 + 1;
    goto LAB_009d502e;
  case SubInt64:
  case RotLInt64:
  case RotRInt64:
    uVar5 = 0x40;
    break;
  case MulInt64:
    IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->right,localInfoProvider);
    IVar9 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
    uVar5 = IVar9 + IVar8;
LAB_009d502e:
    if (local_34 <= uVar5) {
      uVar5 = local_34;
    }
    bVar3 = uVar5 < 0x40;
    uVar7 = 0x40;
    goto LAB_009d4dc1;
  case DivSInt64:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x40;
    if ((pEVar10->_id != ConstId) ||
       (IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider),
       IVar8 == 0x40)) break;
    if (*(long *)(pEVar10 + 2) != 3) {
LAB_009d52b8:
      __assert_fail("type == Type::i64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x129,"int64_t wasm::Literal::geti64() const");
    }
    if (*(long *)(pEVar10 + 1) < 0) break;
LAB_009d5170:
    IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>(pEVar10,(DummyLocalInfoProvider *)0x0);
    uVar5 = (IVar8 - IVar9) + 1;
    if ((int)(IVar8 - IVar9) < 0) {
      uVar5 = 0;
    }
    if ((int)IVar8 <= (int)uVar5) {
      uVar5 = IVar8;
    }
    break;
  case RemSInt64:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x40;
    if ((pEVar10->_id != ConstId) ||
       (IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider),
       IVar8 == 0x40)) break;
    if (*(long *)(pEVar10 + 2) != 3) goto LAB_009d52b8;
    uVar7 = ceilLog2(*(uint64_t *)(pEVar10 + 1));
LAB_009d523b:
    uVar5 = IVar8;
    if (uVar7 < IVar8) {
      uVar5 = uVar7;
    }
    break;
  case RemUInt64:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x40;
    if (pEVar10->_id != ConstId) break;
    uVar5 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
    if (*(long *)(pEVar10 + 2) != 3) goto LAB_009d52b8;
    uVar7 = ceilLog2(*(uint64_t *)(pEVar10 + 1));
LAB_009d4faf:
    bVar3 = uVar7 < uVar5;
    goto LAB_009d5077;
  case AndInt64:
    IVar9 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
    IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->right,localInfoProvider);
    if (IVar9 <= IVar8) {
      IVar8 = IVar9;
    }
    goto LAB_009d4e39;
  case ShlInt64:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x40;
    if (pEVar10->_id != ConstId) break;
    IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
    IVar9 = getEffectiveShifts(pEVar10);
    uVar7 = IVar9 + IVar8;
    bVar3 = uVar7 < 0x40;
    uVar5 = 0x40;
LAB_009d5077:
    if (bVar3) {
      uVar5 = uVar7;
    }
    break;
  case ShrSInt64:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x40;
    if ((pEVar10->_id != ConstId) ||
       (uVar7 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider),
       uVar7 == 0x40)) break;
LAB_009d5112:
    IVar8 = getEffectiveShifts(pEVar10);
    uVar5 = uVar7 - IVar8;
    bVar3 = uVar5 == 0;
    if (uVar7 < IVar8) {
      uVar5 = 0;
    }
    if (uVar7 < IVar8 || bVar3) {
      uVar5 = 0;
    }
    break;
  case ShrUInt64:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x40;
LAB_009d51c9:
    if (pEVar10->_id == ConstId) {
      IVar8 = getMaxBits<wasm::OptimizeInstructions>(((Binary *)curr)->left,localInfoProvider);
      IVar9 = getEffectiveShifts(pEVar10);
      uVar5 = IVar8 - IVar9;
      bVar3 = uVar5 == 0;
      if (IVar8 < IVar9) {
        uVar5 = 0;
      }
      if (IVar8 < IVar9 || bVar3) {
        uVar5 = 0;
      }
    }
    break;
  default:
    goto switchD_009d4bc3_caseD_9;
  }
LAB_009d4d2a:
  if (uVar5 <= local_34) {
    return uVar5;
  }
  return local_34;
}

Assistant:

Index getMaxBits(Expression* curr,
                 LocalInfoProvider* localInfoProvider = nullptr) {
  if (Properties::emitsBoolean(curr)) {
    return 1;
  }
  if (auto* c = curr->dynCast<Const>()) {
    switch (curr->type.getBasic()) {
      case Type::i32:
        return 32 - c->value.countLeadingZeroes().geti32();
      case Type::i64:
        return 64 - c->value.countLeadingZeroes().geti64();
      default:
        WASM_UNREACHABLE("invalid type");
    }
  } else if (auto* binary = curr->dynCast<Binary>()) {
    switch (binary->op) {
      // 32-bit
      case RotLInt32:
      case RotRInt32:
      case SubInt32:
        return 32;
      case AddInt32: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(32), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt32: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(32), maxBitsLeft + maxBitsRight);
      }
      case DivSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // If either side might be negative, then the result will be negative
          if (maxBitsLeft == 32 || c->value.geti32() < 0) {
            return 32;
          }
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return 32;
      }
      case DivUInt32: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return maxBitsLeft;
      }
      case RemSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 32) {
            return 32;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case RemUInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case AndInt32: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt32:
      case XorInt32: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt32: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          return std::min(Index(32),
                          getMaxBits(binary->left, localInfoProvider) +
                            Bits::getEffectiveShifts(shifts));
        }
        return 32;
      }
      case ShrUInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case ShrSInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 32) {
            return 32;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case RotLInt64:
      case RotRInt64:
      case SubInt64:
        return 64;
      case AddInt64: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(64), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt64: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(64), maxBitsLeft + maxBitsRight);
      }
      case DivSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left or right const value is negative
          if (maxBitsLeft == 64 || c->value.geti64() < 0) {
            return 64;
          }
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return 64;
      }
      case DivUInt64: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return maxBitsLeft;
      }
      case RemSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 64) {
            return 64;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case RemUInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case AndInt64: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt64:
      case XorInt64: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt64: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          return std::min(Index(64),
                          Bits::getEffectiveShifts(shifts) + maxBits);
        }
        return 64;
      }
      case ShrUInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      case ShrSInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 64) {
            return 64;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      // comparisons
      case EqInt32:
      case NeInt32:
      case LtSInt32:
      case LtUInt32:
      case LeSInt32:
      case LeUInt32:
      case GtSInt32:
      case GtUInt32:
      case GeSInt32:
      case GeUInt32:

      case EqInt64:
      case NeInt64:
      case LtSInt64:
      case LtUInt64:
      case LeSInt64:
      case LeUInt64:
      case GtSInt64:
      case GtUInt64:
      case GeSInt64:
      case GeUInt64:

      case EqFloat32:
      case NeFloat32:
      case LtFloat32:
      case LeFloat32:
      case GtFloat32:
      case GeFloat32:

      case EqFloat64:
      case NeFloat64:
      case LtFloat64:
      case LeFloat64:
      case GtFloat64:
      case GeFloat64:
        WASM_UNREACHABLE("relationals handled before");
      default: {
      }
    }
  } else if (auto* unary = curr->dynCast<Unary>()) {
    switch (unary->op) {
      case ClzInt32:
      case CtzInt32:
      case PopcntInt32:
        return 6;
      case ClzInt64:
      case CtzInt64:
      case PopcntInt64:
        return 7;
      case EqZInt32:
      case EqZInt64:
        WASM_UNREACHABLE("relationals handled before");
      case WrapInt64:
      case ExtendUInt32:
        return std::min(Index(32), getMaxBits(unary->value, localInfoProvider));
      case ExtendS8Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(32) : maxBits;
      }
      case ExtendS16Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(32) : maxBits;
      }
      case ExtendS8Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(64) : maxBits;
      }
      case ExtendS16Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(64) : maxBits;
      }
      case ExtendS32Int64:
      case ExtendSInt32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 32 ? Index(64) : maxBits;
      }
      default: {
      }
    }
  } else if (auto* set = curr->dynCast<LocalSet>()) {
    // a tee passes through the value
    return getMaxBits(set->value, localInfoProvider);
  } else if (auto* get = curr->dynCast<LocalGet>()) {
    // TODO: Should this be optional?
    assert(localInfoProvider);
    return localInfoProvider->getMaxBitsForLocal(get);
  } else if (auto* load = curr->dynCast<Load>()) {
    // if signed, then the sign-extension might fill all the bits
    // if unsigned, then we have a limit
    if (LoadUtils::isSignRelevant(load) && !load->signed_) {
      return 8 * load->bytes;
    }
  }
  switch (curr->type.getBasic()) {
    case Type::i32:
      return 32;
    case Type::i64:
      return 64;
    case Type::unreachable:
      return 64; // not interesting, but don't crash
    default:
      WASM_UNREACHABLE("invalid type");
  }
}